

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task19.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int i_1;
  long lVar2;
  int i;
  int iVar3;
  int num;
  int n;
  int all_nums [10];
  
  all_nums[4] = 0;
  all_nums[5] = 0;
  all_nums[6] = 0;
  all_nums[7] = 0;
  all_nums[0] = 0;
  all_nums[1] = 0;
  all_nums[2] = 0;
  all_nums[3] = 0;
  all_nums[8] = 0;
  all_nums[9] = 0;
  std::istream::operator>>((istream *)&std::cin,&n);
  for (iVar3 = 0; iVar3 < n; iVar3 = iVar3 + 1) {
    std::istream::operator>>((istream *)&std::cin,&num);
    all_nums[num] = all_nums[num] + 1;
  }
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    iVar3 = all_nums[lVar2];
    if (iVar3 != 0) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar2);
      poVar1 = std::operator<<(poVar1,':');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  return 0;
}

Assistant:

int main(){
    int n;
    int all_nums[10] = {};
    cin >> n;
    for (int i =0; i <n; i++){
        int num;
        cin >> num;
        all_nums[num] ++;
    }
    for (int i = 0; i < 10; i++) if (all_nums[i]) cout << i << ':' << all_nums[i] << endl;
    return 0;
}